

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_enemy.cpp
# Opt level: O0

int AF_AActor_A_Scream(VMValue *param,TArray<VMValue,_VMValue> *defaultparam,int numparam,
                      VMReturn *ret,int numret)

{
  AActor *ent;
  int iVar1;
  uint uVar2;
  bool bVar3;
  bool local_47;
  FSoundID local_44;
  FSoundID local_40;
  TFlags<ActorFlag2,_unsigned_int> local_3c;
  AActor *local_38;
  AActor *self;
  int paramnum;
  int numret_local;
  VMReturn *ret_local;
  TArray<VMValue,_VMValue> *pTStack_18;
  int numparam_local;
  TArray<VMValue,_VMValue> *defaultparam_local;
  VMValue *param_local;
  
  self._0_4_ = 0;
  self._4_4_ = numret;
  _paramnum = ret;
  ret_local._4_4_ = numparam;
  pTStack_18 = defaultparam;
  defaultparam_local = (TArray<VMValue,_VMValue> *)param;
  if (numparam < 1) {
    __assert_fail("(paramnum) < numparam",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_enemy.cpp"
                  ,0xc62,
                  "int AF_AActor_A_Scream(VMValue *, TArray<VMValue> &, int, VMReturn *, int)");
  }
  bVar3 = false;
  if (((param->field_0).field_3.Type == '\x03') &&
     (bVar3 = true, (param->field_0).field_1.atag != 1)) {
    bVar3 = (param->field_0).field_1.a == (void *)0x0;
  }
  if (bVar3) {
    local_38 = *(AActor **)&param->field_0;
    local_47 = true;
    if (local_38 != (AActor *)0x0) {
      local_47 = DObject::IsKindOf((DObject *)local_38,AActor::RegistrationInfo.MyClass);
    }
    if (local_47 != false) {
      iVar1 = FSoundID::operator_cast_to_int(&(local_38->DeathSound).super_FSoundID);
      if (iVar1 != 0) {
        TFlags<ActorFlag2,_unsigned_int>::operator&
                  (&local_3c,(int)local_38 + (MF2_RIP|MF2_NOTELEPORT|MF2_SPAWNFLOAT));
        uVar2 = TFlags::operator_cast_to_unsigned_int((TFlags *)&local_3c);
        ent = local_38;
        if (uVar2 == 0) {
          FSoundID::FSoundID(&local_44,&(local_38->DeathSound).super_FSoundID);
          S_Sound(ent,2,&local_44,1.0,1.0);
        }
        else {
          FSoundID::FSoundID(&local_40,&(local_38->DeathSound).super_FSoundID);
          S_Sound(ent,2,&local_40,1.0,0.0);
        }
      }
      return 0;
    }
    __assert_fail("self == NULL || self->IsKindOf(RUNTIME_CLASS(AActor))",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_enemy.cpp"
                  ,0xc62,
                  "int AF_AActor_A_Scream(VMValue *, TArray<VMValue> &, int, VMReturn *, int)");
  }
  __assert_fail("param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
                ,
                "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_enemy.cpp"
                ,0xc62,"int AF_AActor_A_Scream(VMValue *, TArray<VMValue> &, int, VMReturn *, int)")
  ;
}

Assistant:

DEFINE_ACTION_FUNCTION(AActor, A_Scream)
{
	PARAM_SELF_PROLOGUE(AActor);
	if (self->DeathSound)
	{
		// Check for bosses.
		if (self->flags2 & MF2_BOSS)
		{
			// full volume
			S_Sound (self, CHAN_VOICE, self->DeathSound, 1, ATTN_NONE);
		}
		else
		{
			S_Sound (self, CHAN_VOICE, self->DeathSound, 1, ATTN_NORM);
		}
	}
	return 0;
}